

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O0

void anon_unknown.dwarf_47f3d::testRandomAngles33(void)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  int k;
  int j_1;
  V2f t;
  float r;
  float h;
  int j;
  V2f s;
  M33f M;
  int i;
  Rand48 random;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  Matrix33<float> *in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  Vec2<float> local_b8;
  Matrix33<float> local_b0;
  float local_8c;
  Matrix33<float> local_88;
  float local_64;
  Matrix33<float> local_60;
  int local_3c;
  Vec2<float> local_38;
  Vec2<float> local_30 [4];
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  for (iVar4 = 0; iVar4 < 100000; iVar4 = iVar4 + 1) {
    Imath_3_2::Matrix33<float>::Matrix33((Matrix33<float> *)local_30);
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    in_stack_fffffffffffffef4 = (float)dVar3;
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    Imath_3_2::Vec2<float>::Vec2(&local_38,in_stack_fffffffffffffef4,(float)dVar3);
    for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
      dVar3 = Imath_3_2::Rand48::nextf
                        ((Rand48 *)in_stack_ffffffffffffff00,
                         (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      if (0.5 <= dVar3) {
        pfVar1 = Imath_3_2::Vec2<float>::operator[](&local_38,local_3c);
        *pfVar1 = *pfVar1 * -1.0;
      }
    }
    Imath_3_2::Matrix33<float>::Matrix33(&local_60);
    Imath_3_2::Matrix33<float>::setScale<float>(&local_60,&local_38);
    Imath_3_2::Matrix33<float>::operator*=
              ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_64 = (float)dVar3;
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (0.5 <= dVar3) {
      local_64 = local_64 * -1.0;
    }
    Imath_3_2::Matrix33<float>::Matrix33(&local_88);
    Imath_3_2::Matrix33<float>::setShear<float>(&local_88,&local_64);
    Imath_3_2::Matrix33<float>::operator*=
              ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    local_8c = rad((float)dVar3);
    Imath_3_2::Matrix33<float>::Matrix33(&local_b0);
    Imath_3_2::Matrix33<float>::setRotation<float>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    Imath_3_2::Matrix33<float>::operator*=
              ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    in_stack_fffffffffffffef0 = (float)dVar3;
    dVar3 = Imath_3_2::Rand48::nextf
                      ((Rand48 *)in_stack_ffffffffffffff00,
                       (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    Imath_3_2::Vec2<float>::Vec2(&local_b8,in_stack_fffffffffffffef0,(float)dVar3);
    Imath_3_2::Matrix33<float>::Matrix33((Matrix33<float> *)&stack0xffffffffffffff24);
    Imath_3_2::Matrix33<float>::setTranslation<float>
              ((Matrix33<float> *)&stack0xffffffffffffff24,&local_b8);
    Imath_3_2::Matrix33<float>::operator*=
              ((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    for (in_stack_ffffffffffffff20 = 0; in_stack_ffffffffffffff20 < 3;
        in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1) {
      for (in_stack_ffffffffffffff1c = 0; in_stack_ffffffffffffff1c < 2;
          in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c + 1) {
        dVar3 = Imath_3_2::Rand48::nextf
                          ((Rand48 *)in_stack_ffffffffffffff00,
                           (double)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (double)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
        fVar2 = (float)dVar3;
        pfVar1 = Imath_3_2::Matrix33<float>::operator[]
                           ((Matrix33<float> *)local_30,in_stack_ffffffffffffff20);
        pfVar1[in_stack_ffffffffffffff1c] = fVar2 + pfVar1[in_stack_ffffffffffffff1c];
      }
    }
    Imath_3_2::Matrix33<float>::Matrix33
              ((Matrix33<float> *)&stack0xfffffffffffffef8,(Matrix33<float> *)local_30);
    testMatrix((M33f *)CONCAT44(iVar4,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void
testRandomAngles33 ()
{
    Rand48 r (0);

    float eps = 8.0f * std::numeric_limits<float>::epsilon ();

    for (int i = 0; i < 100000; ++i)
    {
        float angle = rad (float(r.nextf (-180, 180)));

        M33f M;
        M.setRotation (angle);

        float angleEx;
        extractEuler (M, angleEx);

        assert (IMATH_INTERNAL_NAMESPACE::equal (angle, angleEx, eps));
    }
}